

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitTableSize(PrintExpressionContents *this,TableSize *curr)

{
  ostream *stream;
  
  stream = this->o;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"table.size ",0xb);
  Colors::outputColorCode(stream,"\x1b[0m");
  Name::print(&curr->table,this->o);
  return;
}

Assistant:

void visitTableSize(TableSize* curr) {
    printMedium(o, "table.size ");
    curr->table.print(o);
  }